

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void greet_prog_necro_skull(CHAR_DATA *mob,CHAR_DATA *ch)

{
  bool bVar1;
  char *arg1;
  CHAR_DATA *ch_00;
  char *pcVar2;
  CHAR_DATA *in_RSI;
  long in_RDI;
  CHAR_DATA *master;
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffedc8;
  char *__s;
  void *in_stack_ffffffffffffedd0;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffede8;
  char *in_stack_ffffffffffffedf8;
  
  victim = *(CHAR_DATA **)(in_RDI + 0x18);
  if (((in_RSI != victim) && (bVar1 = can_see(in_stack_ffffffffffffede8,victim), bVar1)) &&
     (bVar1 = is_npc(in_stack_ffffffffffffedc8), !bVar1)) {
    act((char *)victim,in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0,in_stack_ffffffffffffedc8
        ,0);
    __s = &stack0xffffffffffffede8;
    arg1 = get_char_color(in_stack_ffffffffffffede8,(char *)victim);
    ch_00 = (CHAR_DATA *)palloc_string(in_stack_ffffffffffffedf8);
    pcVar2 = END_COLOR(ch_00);
    sprintf(__s,"A skull-sentinel whispers to you \'%sMaster, %s has arrived at my location.%s\'",
            arg1,ch_00,pcVar2);
    act((char *)victim,ch_00,arg1,__s,0);
  }
  return;
}

Assistant:

void greet_prog_necro_skull(CHAR_DATA *mob, CHAR_DATA *ch)
{
	char buf[MSL];
	CHAR_DATA *master = mob->leader;

	if (ch == master)
		return;

	if (!can_see(master, ch))
		return;

	if (is_npc(ch))
		return;

	act("$n rises into the air and opens its mouth in a silent shriek!", mob, 0, ch, TO_ROOM);
	sprintf(buf, "A skull-sentinel whispers to you '%sMaster, %s has arrived at my location.%s'",
		get_char_color(ch, "lightred"),
		palloc_string(ch->name),
		END_COLOR(ch));
	act(buf, master, 0, 0, TO_CHAR);
}